

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O1

shared_ptr<nigel::AstCondition> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstCombinationCondition> *cExpr,int priority)

{
  bool bVar1;
  undefined8 uVar2;
  AST_Parser *pAVar3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int in_R8D;
  _func_int **pp_Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  shared_ptr<nigel::AstCondition> sVar7;
  undefined1 local_78 [32];
  AST_Parser *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  _func_int **local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  local_78._24_8_ = CONCAT44(in_register_0000000c,priority);
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(currLVal + 2);
  local_48 = &(cExpr->super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount;
  pp_Var6 = (_func_int **)0x0;
  this_01 = (element_type *)0x0;
  local_78._16_8_ = currLVal;
  local_58 = this;
  while( true ) {
    if ((((cExpr->super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->super_AstCondition).super_AstExpr.type == combinationCondition) {
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)&local_40);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)local_50._M_pi,(key_type *)(local_40 + 10));
      bVar1 = *pmVar4 < in_R8D;
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
    }
    else {
      bVar1 = false;
    }
    if (!bVar1) break;
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_78);
    uVar2 = local_78._8_8_;
    pp_Var6 = (_func_int **)local_78._0_8_;
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = (element_type *)0x0;
    if (this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_78);
    (cExpr->super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_78._0_8_ + 0x40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (local_48,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78._0_8_ + 0x48));
    this_01 = (element_type *)uVar2;
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  if (pp_Var6 == (_func_int **)0x0) {
    ((__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)
    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._16_8_ + 0xb0))->
     _vptr__Sp_counted_base)->_M_ptr = *(element_type **)local_78._24_8_;
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._16_8_ + 0xb0))->
               _M_use_count;
  }
  else {
    pp_Var6[8] = (_func_int *)*(element_type **)local_78._24_8_;
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var6 + 9);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78._24_8_ + 8));
  pAVar3 = local_58;
  sVar7 = AstExpr::as<nigel::AstCondition>((AstExpr *)local_58);
  _Var5 = sVar7.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    _Var5._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pAVar3;
  return (shared_ptr<nigel::AstCondition>)
         sVar7.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstCondition> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstCombinationCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstCombinationCondition> clTerm = nullptr;
		while( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstCombinationCondition>();
			currLVal = currLVal->as<AstCombinationCondition>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstCondition>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstCondition>();
		}
	}